

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O0

void do_close(uv_tcp_t *handle)

{
  int iVar1;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_os_fd_t fd;
  uv_tcp_t *handle_local;
  
  _r = handle;
  if (shutdown_before_close == 1) {
    iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)handle,shutdown_cb);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
              ,0x4d,"uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)","==","0",
              (long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_tcp_close_reset(_r,close_cb);
    if ((long)iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
              ,0x4e,"UV_EINVAL","==","uv_tcp_close_reset(handle, close_cb)",0xffffffffffffffea,"==",
              (long)iVar1);
      abort();
    }
  }
  else if (shutdown_before_close == 2) {
    eval_a._0_4_ = uv_fileno((uv_handle_t *)handle,(uv_os_fd_t *)((long)&eval_a + 4));
    if ((long)(int)eval_a != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
              ,0x51,"r","==","0",(long)(int)eval_a,"==",0);
      abort();
    }
    if (eval_a._4_4_ == -1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
              ,0x52,"(uintptr_t) fd","!=","(-1)",0xffffffffffffffff,"!=",0xffffffffffffffff);
      abort();
    }
    iVar1 = shutdown(eval_a._4_4_,2);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
              ,0x56,"shutdown(fd, SHUT_RDWR)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_tcp_close_reset(_r,close_cb);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
              ,0x58,"uv_tcp_close_reset(handle, close_cb)","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  else {
    iVar1 = uv_tcp_close_reset(handle,close_cb);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
              ,0x5a,"uv_tcp_close_reset(handle, close_cb)","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)_r,shutdown_cb);
    if ((long)iVar1 != -0x6b) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
              ,0x5c,"UV_ENOTCONN","==",
              "uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)",0xffffffffffffff95,
              "==",(long)iVar1);
      abort();
    }
  }
  uv_close((uv_handle_t *)&tcp_server,(uv_close_cb)0x0);
  return;
}

Assistant:

static void do_close(uv_tcp_t* handle) {
  uv_os_fd_t fd;
  int r;

  if (shutdown_before_close == 1) {
    ASSERT_OK(uv_shutdown(&shutdown_req,
                          (uv_stream_t*) handle,
                          shutdown_cb));
    ASSERT_EQ(UV_EINVAL, uv_tcp_close_reset(handle, close_cb));
  } else if (shutdown_before_close == 2) {
    r = uv_fileno((const uv_handle_t*) handle, &fd);
    ASSERT_OK(r);
    ASSERT_NE((uintptr_t) fd, INVALID_FD);
#ifdef _WIN32
    ASSERT_OK(shutdown((SOCKET) fd, SD_BOTH));
#else
    ASSERT_OK(shutdown(fd, SHUT_RDWR));
#endif
    ASSERT_OK(uv_tcp_close_reset(handle, close_cb));
  } else {
    ASSERT_OK(uv_tcp_close_reset(handle, close_cb));
    ASSERT_EQ(UV_ENOTCONN, uv_shutdown(&shutdown_req, (uv_stream_t*) handle,
              shutdown_cb));
  }

  uv_close((uv_handle_t*) &tcp_server, NULL);
}